

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int urlq_getopt_parse(int argc,char **argv,urlq_getopt_t *opts)

{
  char *pcVar1;
  int iVar2;
  ulong sz;
  coda_url *in_RDX;
  undefined8 *in_RSI;
  undefined4 in_EDI;
  int c;
  undefined4 in_stack_ffffffffffffffe0;
  
  do {
    iVar2 = getopt_long(in_EDI,in_RSI,"depr:sPRS",options,0);
    pcVar1 = _optarg;
    if (iVar2 == -1) {
      return 0;
    }
    sz = (ulong)(iVar2 - 0x50);
    switch(sz) {
    case 0:
      *(byte *)&in_RDX->val_str = *(byte *)&in_RDX->val_str & 0xf7 | 8;
      break;
    default:
      return -1;
    case 2:
      *(byte *)&in_RDX->val_str =
           *(byte *)&in_RDX->val_str & 0xcf | (*(byte *)&in_RDX->val_str >> 4 & 3 | 2) << 4;
      break;
    case 3:
      *(byte *)&in_RDX->val_str =
           *(byte *)&in_RDX->val_str & 0xcf | (*(byte *)&in_RDX->val_str >> 4 & 3 | 1) << 4;
      break;
    case 0x14:
      *(byte *)&in_RDX->val_str = *(byte *)&in_RDX->val_str & 0xf8 | 3;
      break;
    case 0x15:
      *(byte *)&in_RDX->val_str = *(byte *)&in_RDX->val_str & 0xf8 | 4;
      break;
    case 0x20:
      *(byte *)&in_RDX->val_str = *(byte *)&in_RDX->val_str & 0xf8 | 1;
      break;
    case 0x22:
      strlen(_optarg);
      iVar2 = coda_url::create_absolute
                        (in_RDX,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),sz,
                         (uint32_t)((ulong)pcVar1 >> 0x20));
      if (iVar2 != 0) {
        fprintf(_stderr,"%s: can\'t parse --refer argument: %s\n",*in_RSI,_optarg);
        return -1;
      }
      break;
    case 0x23:
      *(byte *)&in_RDX->val_str = *(byte *)&in_RDX->val_str & 0xf8 | 2;
    }
  } while( true );
}

Assistant:

int urlq_getopt_parse(int argc, char **argv, urlq_getopt_t *opts)
{
    int c;

    while (-1 != (c = getopt_long(argc, argv, "depr:sPRS", options, NULL)))
    {
        switch (c)
        {
            case 'd': opts->action = URLQ_DECODE; break;
            case 'e': opts->action = URLQ_ENCODE; break;
            case 'p': opts->action = URLQ_UPARSE; break;
            case 's': opts->action = URLQ_USPLIT; break;

            case 'r':
                if (0 != opts->parent.create_absolute(optarg, strlen(optarg), CODA_URL_FETCHABLE))
                {
                    fprintf(stderr, "%s: can't parse --refer argument: %s\n",
                        argv[0], optarg);

                    return -1;
                }
                break;

            case 'P': opts->domain = 1; break;
            case 'R': opts->uflags |= CODA_URL_SUBDOMAIN; break;
            case 'S': opts->uflags |= CODA_URL_FETCHABLE; break;

            default:
                return -1;
        }
    }

    return 0;
}